

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmpseq.c
# Opt level: O3

void sd_add_seq(kseq_t *seq,int file,int use_header)

{
  UT_hash_bucket *pUVar1;
  char *pcVar2;
  UT_hash_handle *pUVar3;
  UT_hash_table *pUVar4;
  UT_hash_handle *pUVar5;
  UT_hash_handle *pUVar6;
  undefined8 *__ptr;
  uint uVar7;
  int iVar8;
  size_t sVar9;
  byte *pbVar10;
  sd_lookup_t *psVar11;
  byte *pbVar12;
  char *__dest;
  UT_hash_table *pUVar13;
  UT_hash_bucket *pUVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  void *__ptr_00;
  UT_hash_bucket *__ptr_01;
  uint uVar19;
  uint uVar20;
  uchar *_hj_key_1;
  uchar *_hj_key;
  long lVar21;
  UT_hash_handle *pUVar22;
  sd_lookup_t *local_40;
  
  local_40 = sd_lookup;
  if (use_header == 0) {
    if (sd_lookup == (sd_lookup_t *)0x0) goto LAB_001023b2;
    pbVar12 = (byte *)(seq->seq).s;
    sVar9 = strlen((char *)pbVar12);
    uVar7 = (uint)sVar9;
    pbVar10 = pbVar12;
    if (uVar7 < 0xc) {
      uVar15 = 0xfeedbeef;
      uVar17 = 0x9e3779b9;
      uVar16 = 0x9e3779b9;
      uVar19 = uVar7;
    }
    else {
      uVar16 = 0x9e3779b9;
      uVar15 = 0xfeedbeef;
      uVar17 = 0x9e3779b9;
      uVar18 = sVar9 & 0xffffffff;
      do {
        uVar15 = uVar15 + *(int *)(pbVar10 + 8);
        uVar19 = uVar15 >> 0xd ^
                 ((uVar16 + *(int *)pbVar10) - (uVar17 + *(int *)(pbVar10 + 4))) - uVar15;
        uVar17 = uVar19 << 8 ^ ((uVar17 + *(int *)(pbVar10 + 4)) - uVar15) - uVar19;
        uVar16 = uVar17 >> 0xd ^ (uVar15 - uVar19) - uVar17;
        uVar19 = uVar16 >> 0xc ^ (uVar19 - uVar17) - uVar16;
        uVar15 = uVar19 << 0x10 ^ (uVar17 - uVar16) - uVar19;
        uVar20 = uVar15 >> 5 ^ (uVar16 - uVar19) - uVar15;
        uVar16 = uVar20 >> 3 ^ (uVar19 - uVar15) - uVar20;
        uVar17 = uVar16 << 10 ^ (uVar15 - uVar20) - uVar16;
        uVar15 = uVar17 >> 0xf ^ (uVar20 - uVar16) - uVar17;
        pbVar10 = pbVar10 + 0xc;
        uVar19 = (int)uVar18 - 0xc;
        uVar18 = (ulong)uVar19;
      } while (0xb < uVar19);
    }
    uVar15 = uVar15 + uVar7;
    switch(uVar19) {
    case 0xb:
      uVar15 = (uint)pbVar10[10] * 0x1000000 + uVar15;
    case 10:
      uVar15 = (uint)pbVar10[9] * 0x10000 + uVar15;
    case 9:
      uVar15 = (uint)pbVar10[8] * 0x100 + uVar15;
    case 8:
      uVar17 = (uint)pbVar10[7] * 0x1000000 + uVar17;
    case 7:
      uVar17 = (uint)pbVar10[6] * 0x10000 + uVar17;
    case 6:
      uVar17 = (uint)pbVar10[5] * 0x100 + uVar17;
    case 5:
      uVar17 = pbVar10[4] + uVar17;
    case 4:
      uVar16 = (uint)pbVar10[3] * 0x1000000 + uVar16;
    case 3:
      uVar16 = (uint)pbVar10[2] * 0x10000 + uVar16;
    case 2:
      uVar16 = (uint)pbVar10[1] * 0x100 + uVar16;
    case 1:
      uVar16 = *pbVar10 + uVar16;
    default:
      uVar7 = uVar15 >> 0xd ^ (uVar16 - uVar17) - uVar15;
      uVar17 = uVar7 << 8 ^ (uVar17 - uVar15) - uVar7;
      uVar16 = uVar17 >> 0xd ^ (uVar15 - uVar7) - uVar17;
      uVar19 = uVar16 >> 0xc ^ (uVar7 - uVar17) - uVar16;
      uVar7 = uVar19 << 0x10 ^ (uVar17 - uVar16) - uVar19;
      uVar16 = uVar7 >> 5 ^ (uVar16 - uVar19) - uVar7;
      uVar19 = uVar16 >> 3 ^ (uVar19 - uVar7) - uVar16;
      uVar7 = uVar19 << 10 ^ (uVar7 - uVar16) - uVar19;
      pUVar13 = (local_40->hh).tbl;
      pUVar22 = pUVar13->buckets
                [pUVar13->num_buckets - 1 & (uVar7 >> 0xf ^ uVar16 - (uVar19 + uVar7))].hh_head;
    }
    while (pUVar22 != (UT_hash_handle *)0x0) {
      lVar21 = (long)pUVar22 - pUVar13->hho;
      if ((sVar9 == *(uint *)(lVar21 + 0x58)) &&
         (iVar8 = bcmp(*(void **)(lVar21 + 0x50),pbVar12,sVar9), iVar8 == 0)) goto LAB_00102f64;
      pUVar22 = *(UT_hash_handle **)(lVar21 + 0x48);
    }
  }
  else if (sd_lookup == (sd_lookup_t *)0x0) {
LAB_001023b2:
    local_40 = (sd_lookup_t *)0x0;
  }
  else {
    pbVar12 = (byte *)(seq->name).s;
    sVar9 = strlen((char *)pbVar12);
    uVar7 = (uint)sVar9;
    pbVar10 = pbVar12;
    if (uVar7 < 0xc) {
      uVar15 = 0xfeedbeef;
      uVar17 = 0x9e3779b9;
      uVar16 = 0x9e3779b9;
      uVar19 = uVar7;
    }
    else {
      uVar16 = 0x9e3779b9;
      uVar15 = 0xfeedbeef;
      uVar17 = 0x9e3779b9;
      uVar18 = sVar9 & 0xffffffff;
      do {
        uVar15 = uVar15 + *(int *)(pbVar10 + 8);
        uVar19 = uVar15 >> 0xd ^
                 ((uVar16 + *(int *)pbVar10) - (uVar17 + *(int *)(pbVar10 + 4))) - uVar15;
        uVar17 = uVar19 << 8 ^ ((uVar17 + *(int *)(pbVar10 + 4)) - uVar15) - uVar19;
        uVar16 = uVar17 >> 0xd ^ (uVar15 - uVar19) - uVar17;
        uVar19 = uVar16 >> 0xc ^ (uVar19 - uVar17) - uVar16;
        uVar15 = uVar19 << 0x10 ^ (uVar17 - uVar16) - uVar19;
        uVar20 = uVar15 >> 5 ^ (uVar16 - uVar19) - uVar15;
        uVar16 = uVar20 >> 3 ^ (uVar19 - uVar15) - uVar20;
        uVar17 = uVar16 << 10 ^ (uVar15 - uVar20) - uVar16;
        uVar15 = uVar17 >> 0xf ^ (uVar20 - uVar16) - uVar17;
        pbVar10 = pbVar10 + 0xc;
        uVar19 = (int)uVar18 - 0xc;
        uVar18 = (ulong)uVar19;
      } while (0xb < uVar19);
    }
    uVar15 = uVar15 + uVar7;
    switch(uVar19) {
    case 0xb:
      uVar15 = (uint)pbVar10[10] * 0x1000000 + uVar15;
    case 10:
      uVar15 = (uint)pbVar10[9] * 0x10000 + uVar15;
    case 9:
      uVar15 = (uint)pbVar10[8] * 0x100 + uVar15;
    case 8:
      uVar17 = (uint)pbVar10[7] * 0x1000000 + uVar17;
    case 7:
      uVar17 = (uint)pbVar10[6] * 0x10000 + uVar17;
    case 6:
      uVar17 = (uint)pbVar10[5] * 0x100 + uVar17;
    case 5:
      uVar17 = pbVar10[4] + uVar17;
    case 4:
      uVar16 = (uint)pbVar10[3] * 0x1000000 + uVar16;
    case 3:
      uVar16 = (uint)pbVar10[2] * 0x10000 + uVar16;
    case 2:
      uVar16 = (uint)pbVar10[1] * 0x100 + uVar16;
    case 1:
      uVar16 = *pbVar10 + uVar16;
    default:
      uVar7 = uVar15 >> 0xd ^ (uVar16 - uVar17) - uVar15;
      uVar17 = uVar7 << 8 ^ (uVar17 - uVar15) - uVar7;
      uVar16 = uVar17 >> 0xd ^ (uVar15 - uVar7) - uVar17;
      uVar19 = uVar16 >> 0xc ^ (uVar7 - uVar17) - uVar16;
      uVar7 = uVar19 << 0x10 ^ (uVar17 - uVar16) - uVar19;
      uVar16 = uVar7 >> 5 ^ (uVar16 - uVar19) - uVar7;
      uVar19 = uVar16 >> 3 ^ (uVar19 - uVar7) - uVar16;
      uVar7 = uVar19 << 10 ^ (uVar7 - uVar16) - uVar19;
      pUVar13 = (local_40->hh).tbl;
      pUVar22 = pUVar13->buckets
                [pUVar13->num_buckets - 1 & (uVar7 >> 0xf ^ uVar16 - (uVar19 + uVar7))].hh_head;
    }
    while (pUVar22 != (UT_hash_handle *)0x0) {
      lVar21 = (long)pUVar22 - pUVar13->hho;
      if ((sVar9 == *(uint *)(lVar21 + 0x58)) &&
         (iVar8 = bcmp(*(void **)(lVar21 + 0x50),pbVar12,sVar9), iVar8 == 0)) {
LAB_00102f64:
        *(int *)(lVar21 + 0x18) = *(int *)(lVar21 + 0x18) + 1;
        if (file == 2) {
          *(undefined4 *)(lVar21 + 0x20) = 1;
          return;
        }
        if (file != 1) {
          return;
        }
        *(undefined4 *)(lVar21 + 0x1c) = 1;
        return;
      }
      pUVar22 = *(UT_hash_handle **)(lVar21 + 0x48);
    }
  }
  psVar11 = (sd_lookup_t *)malloc(0x60);
  if (psVar11 == (sd_lookup_t *)0x0) {
    sd_add_seq_cold_4();
LAB_00102fa5:
    sd_add_seq_cold_3();
  }
  else {
    psVar11->seq = (char *)0x0;
    psVar11->name = (char *)0x0;
    psVar11->count = 1;
    psVar11->in_a = 0;
    psVar11->in_b = 0;
    pcVar2 = (seq->seq).s;
    sVar9 = strlen(pcVar2);
    pbVar12 = (byte *)malloc(sVar9 * 8 + 8);
    psVar11->seq = (char *)pbVar12;
    if (pbVar12 == (byte *)0x0) goto LAB_00102fa5;
    sVar9 = strlen(pcVar2);
    strncpy((char *)pbVar12,pcVar2,sVar9 + 1);
    pcVar2 = (seq->name).s;
    sVar9 = strlen(pcVar2);
    pbVar10 = (byte *)malloc(sVar9 * 8 + 8);
    psVar11->name = (char *)pbVar10;
    if (pbVar10 != (byte *)0x0) {
      sVar9 = strlen(pcVar2);
      strncpy((char *)pbVar10,pcVar2,sVar9 + 1);
      pcVar2 = (seq->comment).s;
      if (pcVar2 == (char *)0x0) {
        psVar11->comment = (char *)0x0;
      }
      else {
        sVar9 = strlen(pcVar2);
        __ptr_00 = (void *)(sVar9 * 8 + 8);
        __dest = (char *)malloc((size_t)__ptr_00);
        psVar11->comment = __dest;
        if (__dest == (char *)0x0) {
          sd_add_seq_cold_1();
          if (__ptr_00 == (void *)0x0) {
            return;
          }
          free(*(void **)((long)__ptr_00 + 0x10));
          free(*(void **)((long)__ptr_00 + 0x28));
          free(*(void **)((long)__ptr_00 + 0x40));
          free(*(void **)((long)__ptr_00 + 0x58));
          __ptr = *(undefined8 **)((long)__ptr_00 + 0x68);
          if (__ptr != (undefined8 *)0x0) {
            free((void *)*__ptr);
            free(__ptr);
          }
          free(__ptr_00);
          return;
        }
        sVar9 = strlen(pcVar2);
        strncpy(__dest,pcVar2,sVar9 + 1);
      }
      if (file == 2) {
        psVar11->in_b = 1;
      }
      else if (file == 1) {
        psVar11->in_a = 1;
      }
      pUVar22 = &psVar11->hh;
      (psVar11->hh).next = (void *)0x0;
      if (use_header == 0) {
        (psVar11->hh).key = pbVar12;
        sVar9 = strlen((char *)pbVar12);
        (psVar11->hh).keylen = (uint)sVar9;
        if (local_40 == (sd_lookup_t *)0x0) {
          sd_lookup = psVar11;
          (psVar11->hh).prev = (void *)0x0;
          pUVar13 = (UT_hash_table *)calloc(1,0x40);
          (psVar11->hh).tbl = pUVar13;
          if (pUVar13 == (UT_hash_table *)0x0) goto LAB_00102faf;
          pUVar13->tail = pUVar22;
          pUVar13->num_buckets = 0x20;
          pUVar13->log2_num_buckets = 5;
          pUVar13->hho = 0x28;
          pUVar14 = (UT_hash_bucket *)calloc(1,0x200);
          pUVar13->buckets = pUVar14;
          if (pUVar14 == (UT_hash_bucket *)0x0) goto LAB_00102faf;
          pUVar13->signature = 0xa0111fe1;
          local_40 = psVar11;
        }
        else {
          pUVar13 = (local_40->hh).tbl;
          pUVar3 = pUVar13->tail;
          pUVar3->next = psVar11;
          (psVar11->hh).prev = (void *)((long)pUVar3 - pUVar13->hho);
          pUVar13->tail = pUVar22;
        }
        uVar19 = pUVar13->num_items + 1;
        pUVar13->num_items = uVar19;
        (psVar11->hh).tbl = pUVar13;
        sVar9 = strlen((char *)pbVar12);
        uVar7 = (uint)sVar9;
        if (uVar7 < 0xc) {
          uVar20 = 0x9e3779b9;
          uVar15 = 0xfeedbeef;
          uVar17 = 0x9e3779b9;
          uVar16 = uVar7;
        }
        else {
          uVar17 = 0x9e3779b9;
          uVar15 = 0xfeedbeef;
          uVar18 = sVar9 & 0xffffffff;
          uVar20 = 0x9e3779b9;
          do {
            uVar15 = uVar15 + *(int *)(pbVar12 + 8);
            uVar16 = uVar15 >> 0xd ^
                     ((uVar20 + *(int *)pbVar12) - (uVar17 + *(int *)(pbVar12 + 4))) - uVar15;
            uVar17 = uVar16 << 8 ^ ((uVar17 + *(int *)(pbVar12 + 4)) - uVar15) - uVar16;
            uVar15 = uVar17 >> 0xd ^ (uVar15 - uVar16) - uVar17;
            uVar16 = uVar15 >> 0xc ^ (uVar16 - uVar17) - uVar15;
            uVar17 = uVar16 << 0x10 ^ (uVar17 - uVar15) - uVar16;
            uVar15 = uVar17 >> 5 ^ (uVar15 - uVar16) - uVar17;
            uVar20 = uVar15 >> 3 ^ (uVar16 - uVar17) - uVar15;
            uVar17 = uVar20 << 10 ^ (uVar17 - uVar15) - uVar20;
            uVar15 = uVar17 >> 0xf ^ (uVar15 - uVar20) - uVar17;
            pbVar12 = pbVar12 + 0xc;
            uVar16 = (int)uVar18 - 0xc;
            uVar18 = (ulong)uVar16;
          } while (0xb < uVar16);
        }
        uVar15 = uVar15 + uVar7;
        (psVar11->hh).hashv = uVar15;
        switch(uVar16) {
        case 0xb:
          uVar15 = (uint)pbVar12[10] * 0x1000000 + uVar15;
          (psVar11->hh).hashv = uVar15;
        case 10:
          uVar15 = (uint)pbVar12[9] * 0x10000 + uVar15;
          (psVar11->hh).hashv = uVar15;
        case 9:
          uVar15 = (uint)pbVar12[8] * 0x100 + uVar15;
          (psVar11->hh).hashv = uVar15;
        case 8:
          uVar17 = (uint)pbVar12[7] * 0x1000000 + uVar17;
        case 7:
          uVar17 = (uint)pbVar12[6] * 0x10000 + uVar17;
        case 6:
          uVar17 = (uint)pbVar12[5] * 0x100 + uVar17;
        case 5:
          uVar17 = pbVar12[4] + uVar17;
        case 4:
          uVar20 = (uint)pbVar12[3] * 0x1000000 + uVar20;
        case 3:
          uVar20 = (uint)pbVar12[2] * 0x10000 + uVar20;
        case 2:
          uVar20 = (uint)pbVar12[1] * 0x100 + uVar20;
        case 1:
          uVar20 = *pbVar12 + uVar20;
        }
        uVar7 = uVar15 >> 0xd ^ (uVar20 - uVar17) - uVar15;
        uVar17 = uVar7 << 8 ^ (uVar17 - uVar15) - uVar7;
        uVar15 = uVar17 >> 0xd ^ (uVar15 - uVar7) - uVar17;
        uVar16 = uVar15 >> 0xc ^ (uVar7 - uVar17) - uVar15;
        uVar7 = uVar16 << 0x10 ^ (uVar17 - uVar15) - uVar16;
        uVar15 = uVar7 >> 5 ^ (uVar15 - uVar16) - uVar7;
        uVar16 = uVar15 >> 3 ^ (uVar16 - uVar7) - uVar15;
        uVar7 = uVar16 << 10 ^ (uVar7 - uVar15) - uVar16;
        uVar7 = uVar7 >> 0xf ^ uVar15 - (uVar16 + uVar7);
        (psVar11->hh).hashv = uVar7;
        pUVar4 = (local_40->hh).tbl;
        uVar7 = pUVar4->num_buckets - 1 & uVar7;
        pUVar14 = pUVar4->buckets;
        pUVar14[uVar7].count = pUVar14[uVar7].count + 1;
        pUVar3 = pUVar14[uVar7].hh_head;
        (psVar11->hh).hh_next = pUVar3;
        (psVar11->hh).hh_prev = (UT_hash_handle *)0x0;
        if (pUVar3 != (UT_hash_handle *)0x0) {
          pUVar3->hh_prev = pUVar22;
        }
        pUVar14[uVar7].hh_head = pUVar22;
        pUVar14 = ((sd_lookup->hh).tbl)->buckets;
        if (pUVar14[uVar7].count < pUVar14[uVar7].expand_mult * 10 + 10) {
          return;
        }
        if (pUVar13->noexpand == 1) {
          return;
        }
        uVar7 = pUVar13->num_buckets;
        pUVar14 = (UT_hash_bucket *)calloc(1,(ulong)(uVar7 * 2) << 4);
        if (pUVar14 == (UT_hash_bucket *)0x0) goto LAB_00102faf;
        uVar16 = uVar7 * 2 - 1;
        uVar19 = ((uVar19 >> ((char)pUVar13->log2_num_buckets + 1U & 0x1f)) + 1) -
                 (uint)((uVar16 & uVar19) == 0);
        pUVar13->ideal_chain_maxlen = uVar19;
        pUVar13->nonideal_items = 0;
        __ptr_01 = pUVar13->buckets;
        if ((ulong)uVar7 != 0) {
          uVar15 = 0;
          uVar18 = 0;
          do {
            pUVar3 = __ptr_01[uVar18].hh_head;
            while (pUVar3 != (UT_hash_handle *)0x0) {
              pUVar5 = pUVar3->hh_next;
              uVar20 = pUVar3->hashv & uVar16;
              pUVar1 = pUVar14 + uVar20;
              uVar17 = pUVar14[uVar20].count + 1;
              pUVar14[uVar20].count = uVar17;
              if (uVar19 < uVar17) {
                uVar15 = uVar15 + 1;
                pUVar13->nonideal_items = uVar15;
                pUVar1->expand_mult = uVar17 / uVar19;
              }
              pUVar3->hh_prev = (UT_hash_handle *)0x0;
              pUVar6 = pUVar1->hh_head;
              pUVar3->hh_next = pUVar6;
              if (pUVar6 != (UT_hash_handle *)0x0) {
                pUVar6->hh_prev = pUVar3;
              }
              pUVar1->hh_head = pUVar3;
              pUVar3 = pUVar5;
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 != uVar7);
        }
LAB_00102dd5:
        free(__ptr_01);
        pUVar13 = pUVar22->tbl;
        pUVar13->num_buckets = pUVar13->num_buckets << 1;
        pUVar13->log2_num_buckets = pUVar13->log2_num_buckets + 1;
        pUVar13->buckets = pUVar14;
        if (pUVar13->num_items >> 1 < pUVar13->nonideal_items) {
          uVar7 = pUVar13->ineff_expands + 1;
          pUVar13->ineff_expands = uVar7;
          if (1 < uVar7) {
            pUVar13->noexpand = 1;
          }
        }
        else {
          pUVar13->ineff_expands = 0;
        }
        return;
      }
      (psVar11->hh).key = pbVar10;
      sVar9 = strlen((char *)pbVar10);
      (psVar11->hh).keylen = (uint)sVar9;
      if (local_40 == (sd_lookup_t *)0x0) {
        sd_lookup = psVar11;
        (psVar11->hh).prev = (void *)0x0;
        pUVar13 = (UT_hash_table *)calloc(1,0x40);
        (psVar11->hh).tbl = pUVar13;
        if (pUVar13 == (UT_hash_table *)0x0) goto LAB_00102faf;
        pUVar13->tail = pUVar22;
        pUVar13->num_buckets = 0x20;
        pUVar13->log2_num_buckets = 5;
        pUVar13->hho = 0x28;
        pUVar14 = (UT_hash_bucket *)calloc(1,0x200);
        pUVar13->buckets = pUVar14;
        if (pUVar14 == (UT_hash_bucket *)0x0) goto LAB_00102faf;
        pUVar13->signature = 0xa0111fe1;
        local_40 = psVar11;
      }
      else {
        pUVar13 = (local_40->hh).tbl;
        pUVar3 = pUVar13->tail;
        pUVar3->next = psVar11;
        (psVar11->hh).prev = (void *)((long)pUVar3 - pUVar13->hho);
        pUVar13->tail = pUVar22;
      }
      uVar19 = pUVar13->num_items + 1;
      pUVar13->num_items = uVar19;
      (psVar11->hh).tbl = pUVar13;
      sVar9 = strlen((char *)pbVar10);
      uVar7 = (uint)sVar9;
      if (uVar7 < 0xc) {
        uVar20 = 0x9e3779b9;
        uVar15 = 0xfeedbeef;
        uVar17 = 0x9e3779b9;
        uVar16 = uVar7;
      }
      else {
        uVar17 = 0x9e3779b9;
        uVar15 = 0xfeedbeef;
        uVar18 = sVar9 & 0xffffffff;
        uVar20 = 0x9e3779b9;
        do {
          uVar15 = uVar15 + *(int *)(pbVar10 + 8);
          uVar16 = uVar15 >> 0xd ^
                   ((uVar20 + *(int *)pbVar10) - (uVar17 + *(int *)(pbVar10 + 4))) - uVar15;
          uVar17 = uVar16 << 8 ^ ((uVar17 + *(int *)(pbVar10 + 4)) - uVar15) - uVar16;
          uVar15 = uVar17 >> 0xd ^ (uVar15 - uVar16) - uVar17;
          uVar16 = uVar15 >> 0xc ^ (uVar16 - uVar17) - uVar15;
          uVar17 = uVar16 << 0x10 ^ (uVar17 - uVar15) - uVar16;
          uVar15 = uVar17 >> 5 ^ (uVar15 - uVar16) - uVar17;
          uVar20 = uVar15 >> 3 ^ (uVar16 - uVar17) - uVar15;
          uVar17 = uVar20 << 10 ^ (uVar17 - uVar15) - uVar20;
          uVar15 = uVar17 >> 0xf ^ (uVar15 - uVar20) - uVar17;
          pbVar10 = pbVar10 + 0xc;
          uVar16 = (int)uVar18 - 0xc;
          uVar18 = (ulong)uVar16;
        } while (0xb < uVar16);
      }
      uVar15 = uVar15 + uVar7;
      (psVar11->hh).hashv = uVar15;
      switch(uVar16) {
      case 0xb:
        uVar15 = (uint)pbVar10[10] * 0x1000000 + uVar15;
        (psVar11->hh).hashv = uVar15;
      case 10:
        uVar15 = (uint)pbVar10[9] * 0x10000 + uVar15;
        (psVar11->hh).hashv = uVar15;
      case 9:
        uVar15 = (uint)pbVar10[8] * 0x100 + uVar15;
        (psVar11->hh).hashv = uVar15;
      case 8:
        uVar17 = (uint)pbVar10[7] * 0x1000000 + uVar17;
      case 7:
        uVar17 = (uint)pbVar10[6] * 0x10000 + uVar17;
      case 6:
        uVar17 = (uint)pbVar10[5] * 0x100 + uVar17;
      case 5:
        uVar17 = pbVar10[4] + uVar17;
      case 4:
        uVar20 = (uint)pbVar10[3] * 0x1000000 + uVar20;
      case 3:
        uVar20 = (uint)pbVar10[2] * 0x10000 + uVar20;
      case 2:
        uVar20 = (uint)pbVar10[1] * 0x100 + uVar20;
      case 1:
        uVar20 = *pbVar10 + uVar20;
      }
      uVar7 = uVar15 >> 0xd ^ (uVar20 - uVar17) - uVar15;
      uVar17 = uVar7 << 8 ^ (uVar17 - uVar15) - uVar7;
      uVar15 = uVar17 >> 0xd ^ (uVar15 - uVar7) - uVar17;
      uVar16 = uVar15 >> 0xc ^ (uVar7 - uVar17) - uVar15;
      uVar7 = uVar16 << 0x10 ^ (uVar17 - uVar15) - uVar16;
      uVar15 = uVar7 >> 5 ^ (uVar15 - uVar16) - uVar7;
      uVar16 = uVar15 >> 3 ^ (uVar16 - uVar7) - uVar15;
      uVar7 = uVar16 << 10 ^ (uVar7 - uVar15) - uVar16;
      uVar7 = uVar7 >> 0xf ^ uVar15 - (uVar16 + uVar7);
      (psVar11->hh).hashv = uVar7;
      pUVar4 = (local_40->hh).tbl;
      uVar7 = pUVar4->num_buckets - 1 & uVar7;
      pUVar14 = pUVar4->buckets;
      pUVar14[uVar7].count = pUVar14[uVar7].count + 1;
      pUVar3 = pUVar14[uVar7].hh_head;
      (psVar11->hh).hh_next = pUVar3;
      (psVar11->hh).hh_prev = (UT_hash_handle *)0x0;
      if (pUVar3 != (UT_hash_handle *)0x0) {
        pUVar3->hh_prev = pUVar22;
      }
      pUVar14[uVar7].hh_head = pUVar22;
      pUVar14 = ((sd_lookup->hh).tbl)->buckets;
      if (pUVar14[uVar7].count < pUVar14[uVar7].expand_mult * 10 + 10) {
        return;
      }
      if (pUVar13->noexpand == 1) {
        return;
      }
      uVar7 = pUVar13->num_buckets;
      pUVar14 = (UT_hash_bucket *)calloc(1,(ulong)(uVar7 * 2) << 4);
      if (pUVar14 != (UT_hash_bucket *)0x0) {
        uVar16 = uVar7 * 2 - 1;
        uVar19 = ((uVar19 >> ((char)pUVar13->log2_num_buckets + 1U & 0x1f)) + 1) -
                 (uint)((uVar16 & uVar19) == 0);
        pUVar13->ideal_chain_maxlen = uVar19;
        pUVar13->nonideal_items = 0;
        __ptr_01 = pUVar13->buckets;
        if ((ulong)uVar7 != 0) {
          uVar15 = 0;
          uVar18 = 0;
          do {
            pUVar3 = __ptr_01[uVar18].hh_head;
            while (pUVar3 != (UT_hash_handle *)0x0) {
              pUVar5 = pUVar3->hh_next;
              uVar20 = pUVar3->hashv & uVar16;
              pUVar1 = pUVar14 + uVar20;
              uVar17 = pUVar14[uVar20].count + 1;
              pUVar14[uVar20].count = uVar17;
              if (uVar19 < uVar17) {
                uVar15 = uVar15 + 1;
                pUVar13->nonideal_items = uVar15;
                pUVar1->expand_mult = uVar17 / uVar19;
              }
              pUVar3->hh_prev = (UT_hash_handle *)0x0;
              pUVar6 = pUVar1->hh_head;
              pUVar3->hh_next = pUVar6;
              if (pUVar6 != (UT_hash_handle *)0x0) {
                pUVar6->hh_prev = pUVar3;
              }
              pUVar1->hh_head = pUVar3;
              pUVar3 = pUVar5;
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 != uVar7);
        }
        goto LAB_00102dd5;
      }
      goto LAB_00102faf;
    }
  }
  sd_add_seq_cold_2();
LAB_00102faf:
  exit(-1);
}

Assistant:

void sd_add_seq(kseq_t *seq, int file, int use_header)
{
	sd_lookup_t *s;

	if (use_header)
		HASH_FIND_STR(sd_lookup,seq->name.s,s);
	else
		HASH_FIND_STR(sd_lookup,seq->seq.s,s);

	if (s==NULL) { /* key is not in hash */
		s = (sd_lookup_t *)malloc(sizeof(sd_lookup_t));
		if (s == NULL) {
			fprintf(stderr,"couldn't get memory for sd_lookup_t\n");
			exit(EXIT_FAILURE);
		} else {
			/* initialize struct */
			s->seq = NULL;
			s->name = NULL;
			s->count = 1;
			s->in_a = 0;
			s->in_b = 0;
		}

		s->seq = (char *)malloc((sizeof(char*) * (strlen(seq->seq.s)+1)));
		if (s->seq == NULL) {
			fprintf(stderr,"couldn't get memory for seq string\n");
			exit(EXIT_FAILURE);
		} else
			strncpy(s->seq,seq->seq.s,strlen(seq->seq.s)+1);

		s->name = (char *)malloc((sizeof(char*) * (strlen(seq->name.s)+1)));
		if (s->name == NULL) {
			fprintf(stderr,"couldn't get memory for name string\n");
			exit(EXIT_FAILURE);
		} else
			strncpy(s->name,seq->name.s,strlen(seq->name.s)+1);

		if (seq->comment.s != NULL) {
			s->comment = (char *)malloc((sizeof(char*) * (strlen(seq->comment.s)+1)));
			if (s->comment == NULL) {
				fprintf(stderr,"couldn't get memory for comment string\n");
				exit(EXIT_FAILURE);
			} else
				strncpy(s->comment,seq->comment.s,strlen(seq->comment.s)+1);
		} else
			s->comment = NULL;

		if (file == 1)
			s->in_a = 1;
		else if (file == 2)
			s->in_b = 1;
		if (use_header)
			HASH_ADD_KEYPTR( hh, sd_lookup, s->name, strlen(s->name), s );
		else
			HASH_ADD_KEYPTR( hh, sd_lookup, s->seq, strlen(s->seq), s );
	} else {
		s->count++; /* key is already in the hash, just incr count */
		if (file == 1)
			s->in_a = 1;
		else if (file == 2)
			s->in_b = 1;
	}
}